

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
          (ExclusiveJoinPromiseNode *this,Own<kj::_::PromiseNode> *left,
          Own<kj::_::PromiseNode> *right)

{
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00448aa0;
  local_28.disposer = left->disposer;
  local_28.ptr = left->ptr;
  left->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->left,this,&local_28);
  if (local_28.ptr != (PromiseNode *)0x0) {
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,
               (local_28.ptr)->_vptr_PromiseNode[-2] + (long)&(local_28.ptr)->_vptr_PromiseNode);
  }
  local_38.disposer = right->disposer;
  local_38.ptr = right->ptr;
  right->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->right,this,&local_38);
  if (local_38.ptr != (PromiseNode *)0x0) {
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,
               (local_38.ptr)->_vptr_PromiseNode[-2] + (long)&(local_38.ptr)->_vptr_PromiseNode);
  }
  (this->onReadyEvent).event = (Event *)0x0;
  return;
}

Assistant:

ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(Own<PromiseNode> left, Own<PromiseNode> right)
    : left(*this, kj::mv(left)), right(*this, kj::mv(right)) {}